

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
           (uint *begin,uint *end)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int __tmp;
  ulong uVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
  pVar10;
  
  lVar7 = 8;
  while( true ) {
    uVar2 = *(uint *)((long)begin + lVar7);
    uVar4 = (ulong)uVar2;
    uVar3 = (uint)*(undefined8 *)begin;
    if (((int)uVar3 <= (int)uVar2) &&
       ((uVar6 = (uint)((ulong)*(undefined8 *)begin >> 0x20), (int)uVar3 < (int)uVar2 ||
        ((int)uVar6 <= *(int *)((long)begin + lVar7 + 4))))) break;
    lVar7 = lVar7 + 8;
  }
  puVar1 = (uint *)((long)begin + lVar7);
  puVar9 = puVar1;
  if (lVar7 == 8) {
    for (puVar8 = end + -2;
        ((end = puVar8 + 2, puVar5 = end, puVar1 < end &&
         (end = puVar8, puVar5 = puVar8, (int)uVar3 <= (int)*puVar8)) &&
        (((int)uVar3 < (int)*puVar8 || ((int)uVar6 <= (int)puVar8[1])))); puVar8 = puVar8 + -2) {
    }
  }
  else {
    do {
      puVar8 = end;
      end = puVar8 + -2;
      puVar5 = end;
      if ((int)*end < (int)uVar3) break;
    } while (((int)uVar3 < (int)*end) || ((int)uVar6 <= (int)puVar8[-1]));
  }
  do {
    if (end <= puVar9) {
      pVar10._9_7_ = (undefined7)(uVar4 >> 8);
      pVar10.second = puVar5 <= puVar1;
      *begin = puVar9[-2];
      begin[1] = puVar9[-1];
      puVar9[-2] = uVar3;
      puVar9[-1] = uVar6;
      pVar10.first._M_current = (pair<int,_int> *)(puVar9 + -2);
      return pVar10;
    }
    *puVar9 = *end;
    *end = (uint)uVar4;
    uVar2 = puVar9[1];
    puVar9[1] = end[1];
    end[1] = uVar2;
    do {
      do {
        puVar8 = puVar9;
        puVar9 = puVar8 + 2;
        uVar2 = *puVar9;
        uVar4 = (ulong)uVar2;
      } while ((int)uVar2 < (int)uVar3);
    } while (((int)uVar2 <= (int)uVar3) && ((int)puVar8[3] < (int)uVar6));
    do {
      puVar8 = end;
      end = puVar8 + -2;
      if ((int)*end < (int)uVar3) break;
    } while (((int)uVar3 < (int)*end) || ((int)uVar6 <= (int)puVar8[-1]));
  } while( true );
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }